

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O3

StringList * __thiscall
CommandLine::process(StringList *__return_storage_ptr__,CommandLine *this,int argc,char **argv)

{
  size_t __n;
  undefined1 *puVar1;
  char **ppcVar2;
  int iVar3;
  CommandLineOption **ppCVar4;
  CommandLineOption *pCVar5;
  string *this_00;
  long lVar6;
  int iVar7;
  bool bVar8;
  String name;
  String value;
  String arg;
  undefined1 *local_110;
  size_t local_108;
  undefined1 local_100 [20];
  int local_ec;
  ulong local_e8;
  char *local_e0;
  undefined8 local_d8;
  char local_d0 [16];
  char **local_c0;
  String local_b8;
  String local_98;
  List<CommandLineOption_*> *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish._M_cur
       = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start._M_node
       = (_Map_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_c0 = argv;
  local_78 = &this->_options;
  std::_Deque_base<String,_std::allocator<String>_>::_M_initialize_map
            ((_Deque_base<String,_std::allocator<String>_> *)__return_storage_ptr__,0);
  if (1 < argc) {
    local_ec = argc + -1;
    iVar7 = 1;
    local_e8 = (ulong)(uint)argc;
    do {
      std::__cxx11::string::string((string *)&local_b8,local_c0[iVar7],(allocator *)&local_110);
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--","");
      puVar1 = local_110;
      __n = CONCAT44(local_b8._string._M_string_length._4_4_,(int)local_b8._string._M_string_length)
      ;
      if (__n == local_108) {
        if (__n == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp(local_b8._string._M_dataplus._M_p,local_110,__n);
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if (puVar1 != local_100) {
        operator_delete(puVar1);
      }
      ppcVar2 = local_c0;
      if (bVar8) {
        iVar3 = iVar7 + 1;
        bVar8 = true;
        if (iVar3 < (int)local_e8) {
          iVar7 = local_ec - iVar7;
          lVar6 = 0;
          do {
            std::__cxx11::string::string
                      ((string *)&local_110,ppcVar2[iVar3 + lVar6],(allocator *)&local_e0);
            std::deque<String,_std::allocator<String>_>::push_back
                      ((deque<String,_std::allocator<String>_> *)__return_storage_ptr__,
                       (value_type *)&local_110);
            if (local_110 != local_100) {
              operator_delete(local_110);
            }
            lVar6 = lVar6 + 1;
          } while (iVar7 != (int)lVar6);
          iVar3 = (int)local_e8;
        }
      }
      else {
        iVar3 = iVar7;
        if (*local_b8._string._M_dataplus._M_p == '-') {
          if (local_b8._string._M_dataplus._M_p[1] == '-') {
            local_110 = local_100;
            local_108 = 0;
            local_100[0] = 0;
            local_e0 = local_d0;
            local_d8 = 0;
            local_d0[0] = '\0';
            iVar7 = String::firstIndexOf(&local_b8,"=",2);
            if (iVar7 == -1) {
              String::mid(&local_98,&local_b8,2,-1);
              this_00 = (string *)&local_110;
            }
            else {
              String::mid(&local_98,&local_b8,2,(long)iVar7);
              std::__cxx11::string::operator=((string *)&local_110,(string *)&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._string._M_dataplus._M_p != &local_98._string.field_2) {
                operator_delete(local_98._string._M_dataplus._M_p);
              }
              String::mid(&local_98,&local_b8,(long)(iVar7 + 1),-1);
              this_00 = (string *)&local_e0;
            }
            std::__cxx11::string::operator=(this_00,(string *)&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._string._M_dataplus._M_p != &local_98._string.field_2) {
              operator_delete(local_98._string._M_dataplus._M_p);
            }
            local_70._8_8_ = 0;
            local_58 = std::
                       _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:123:51)>
                       ::_M_invoke;
            local_60 = std::
                       _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:123:51)>
                       ::_M_manager;
            local_70._M_unused._0_8_ = (string *)&local_110;
            ppCVar4 = List<CommandLineOption_*>::find
                                (local_78,(function<bool_(CommandLineOption_*const_&)> *)&local_70);
            if (local_60 != (code *)0x0) {
              (*local_60)(&local_70,&local_70,__destroy_functor);
            }
            if (ppCVar4 == (CommandLineOption **)0x0) {
              error<String>("unknown option --%1",(String *)&local_110);
            }
            pCVar5 = *ppCVar4;
            if ((pCVar5->_type == (type_info *)&bool::typeinfo) && (*local_e0 != '\0')) {
              CommandLineOption::describe(&local_98,pCVar5);
              error<String>("option %1 does not take a value",&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._string._M_dataplus._M_p != &local_98._string.field_2) {
                operator_delete(local_98._string._M_dataplus._M_p);
              }
              pCVar5 = *ppCVar4;
            }
            (*pCVar5->_vptr_CommandLineOption[2])(pCVar5,&local_e0);
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
            if (local_110 != local_100) {
              operator_delete(local_110);
            }
          }
          else {
            if (local_b8._string._M_dataplus._M_p[1] == '\0') goto LAB_001106a6;
            local_e0 = (char *)CONCAT44(local_e0._4_4_,1);
            if (1 < (int)local_b8._string._M_string_length) {
              do {
                local_50._8_8_ = &local_e0;
                local_38 = std::
                           _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:74:52)>
                           ::_M_invoke;
                local_40 = std::
                           _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:74:52)>
                           ::_M_manager;
                local_50._M_unused._M_object = &local_b8;
                ppCVar4 = List<CommandLineOption_*>::find
                                    (local_78,(function<bool_(CommandLineOption_*const_&)> *)
                                              &local_50);
                if (local_40 != (code *)0x0) {
                  (*local_40)(&local_50,&local_50,__destroy_functor);
                }
                if (ppCVar4 == (CommandLineOption **)0x0) {
                  error<char>("unknown option -%1",local_b8._string._M_dataplus._M_p + (int)local_e0
                             );
                }
                pCVar5 = *ppCVar4;
                if (pCVar5->_type == (type_info *)&bool::typeinfo) {
                  local_110 = local_100;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
                  (*pCVar5->_vptr_CommandLineOption[2])(pCVar5,(string *)&local_110);
                  if (local_110 != local_100) {
                    operator_delete(local_110);
                  }
                }
                else {
                  if (iVar3 == local_ec) {
                    CommandLineOption::describe((String *)&local_110,pCVar5);
                    error<String>("option -%1 requires a parameter",(String *)&local_110);
                    if (local_110 != local_100) {
                      operator_delete(local_110);
                    }
                  }
                  if ((int)local_e0 != (int)local_b8._string._M_string_length + -1) {
                    CommandLineOption::describe((String *)&local_110,pCVar5);
                    error<String,char>("option %1 requires a parameter but has option -%2 stacked on"
                                       ,(String *)&local_110,
                                       local_b8._string._M_dataplus._M_p + (long)(int)local_e0 + 1);
                    if (local_110 != local_100) {
                      operator_delete(local_110);
                    }
                  }
                  std::__cxx11::string::string
                            ((string *)&local_110,local_c0[(long)iVar3 + 1],(allocator *)&local_98);
                  (*pCVar5->_vptr_CommandLineOption[2])(pCVar5,(string *)&local_110);
                  if (local_110 != local_100) {
                    operator_delete(local_110);
                  }
                  iVar3 = iVar3 + 1;
                }
                iVar7 = (int)local_e0 + 1;
                local_e0 = (char *)CONCAT44(local_e0._4_4_,iVar7);
              } while (iVar7 < (int)local_b8._string._M_string_length);
            }
          }
          bVar8 = false;
        }
        else {
LAB_001106a6:
          bVar8 = false;
          std::deque<String,_std::allocator<String>_>::push_back
                    ((deque<String,_std::allocator<String>_> *)__return_storage_ptr__,&local_b8);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._string._M_dataplus._M_p != &local_b8._string.field_2) {
        operator_delete(local_b8._string._M_dataplus._M_p);
      }
      if (bVar8) {
        return __return_storage_ptr__;
      }
      iVar7 = iVar3 + 1;
    } while (iVar7 < (int)local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

StringList CommandLine::process (int const argc, char* argv[])
{
	StringList args;

	for (int argn = 1; argn < argc; ++argn)
	{
		String const arg (argv[argn]);

		if (arg == "--")
		{
			// terminating option - write everything to args and be done with it.
			while (++argn < argc)
				args << argv[argn];

			break;
		}

		if (arg[0] != '-' or arg[1] == '\0')
		{
			// non-option argument - pass to result
			args << arg;
			continue;
		}

		if (arg[1] != '-' and arg[1] != '\0')
		{
			// short-form options
			for (int i = 1; i < arg.length(); ++i)
			{
				CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
				{
					return arg[i] == a->shortform();
				});

				if (not optionptr)
					error ("unknown option -%1", arg[i]);

				CommandLineOption* option = *optionptr;

				if (option->isOfType<bool>())
				{
					// Bool options need no parameters
					option->handleValue ("");
				}
				else
				{
					// Ensure we got a valid parameter coming up
					if (argn == argc - 1)
						error ("option -%1 requires a parameter", option->describe());

					if (i != arg.length() - 1)
					{
						error ("option %1 requires a parameter but has option -%2 stacked on",
							option->describe(), arg[i + 1]);
					}

					option->handleValue (argv[++argn]);
				}
			}
		}
		else
		{
			// long-form options
			String name, value;
			{
				int idx = arg.firstIndexOf ("=", 2);

				if (idx != -1)
				{
					name = arg.mid (2, idx);
					value = arg.mid (idx + 1);
				}
				else
				{
					name = arg.mid (2);
				}
			}

			CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
			{
				return a->longform() == name;
			});

			if (not optionptr)
				error ("unknown option --%1", name);

			if ((*optionptr)->isOfType<bool>() and not value.isEmpty())
				error ("option %1 does not take a value", (*optionptr)->describe());
 
			(*optionptr)->handleValue (value);
		}
	}

	return args;
}